

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

void object_absorb_partial(object *obj1,object *obj2,object_stack_t mode1,object_stack_t mode2)

{
  byte bVar1;
  ushort uVar2;
  _Bool _Var3;
  int iVar4;
  uint local_58;
  uint local_50;
  uint local_48;
  uint local_44;
  wchar_t difference_1;
  wchar_t limit_1;
  wchar_t difference;
  wchar_t limit;
  wchar_t newsz2;
  wchar_t newsz1;
  wchar_t largest;
  wchar_t smallest;
  object_stack_t mode2_local;
  object_stack_t mode1_local;
  object *obj2_local;
  object *obj1_local;
  
  if (obj2->number < obj1->number) {
    bVar1 = obj2->number;
  }
  else {
    bVar1 = obj1->number;
  }
  local_44 = (uint)bVar1;
  if (obj1->number < obj2->number) {
    bVar1 = obj2->number;
  }
  else {
    bVar1 = obj1->number;
  }
  local_48 = (uint)bVar1;
  if (((mode1 & OSTACK_STORE) == OSTACK_NONE) && ((mode2 & OSTACK_STORE) == OSTACK_NONE)) {
    if ((mode1 & OSTACK_QUIVER) == OSTACK_NONE) {
      if ((mode2 & OSTACK_QUIVER) == OSTACK_NONE) {
        iVar4 = obj1->kind->base->max_stack - local_48;
        limit = local_48 + iVar4;
        difference = local_44 - iVar4;
      }
      else {
        uVar2 = z_info->quiver_slot_size;
        _Var3 = tval_is_ammo(obj2);
        if (_Var3) {
          local_58 = 1;
        }
        else {
          local_58 = (uint)z_info->thrown_quiver_mult;
        }
        difference = uVar2 / local_58;
        limit = (local_48 + local_44) - difference;
        if (obj1->kind->base->max_stack <= limit) {
          __assert_fail("newsz1 < obj1->kind->base->max_stack",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-pile.c"
                        ,0x28f,
                        "void object_absorb_partial(struct object *, struct object *, object_stack_t, object_stack_t)"
                       );
        }
      }
    }
    else {
      uVar2 = z_info->quiver_slot_size;
      _Var3 = tval_is_ammo(obj1);
      if (_Var3) {
        local_50 = 1;
      }
      else {
        local_50 = (uint)z_info->thrown_quiver_mult;
      }
      limit = uVar2 / local_50;
      if ((mode2 & OSTACK_QUIVER) == OSTACK_NONE) {
        difference = (local_48 + local_44) - limit;
        if (obj1->kind->base->max_stack <= difference) {
          __assert_fail("newsz2 < obj1->kind->base->max_stack",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-pile.c"
                        ,0x285,
                        "void object_absorb_partial(struct object *, struct object *, object_stack_t, object_stack_t)"
                       );
        }
      }
      else {
        iVar4 = limit - local_48;
        limit = local_48 + iVar4;
        difference = local_44 - iVar4;
      }
    }
    obj1->number = (uint8_t)limit;
    obj2->number = (uint8_t)difference;
    object_absorb_merge(obj1,obj2);
    return;
  }
  __assert_fail("!(mode1 & OSTACK_STORE) && !(mode2 & OSTACK_STORE)",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-pile.c"
                ,0x274,
                "void object_absorb_partial(struct object *, struct object *, object_stack_t, object_stack_t)"
               );
}

Assistant:

void object_absorb_partial(struct object *obj1, struct object *obj2,
	object_stack_t mode1, object_stack_t mode2)
{
	int smallest = MIN(obj1->number, obj2->number);
	int largest = MAX(obj1->number, obj2->number);
	int newsz1, newsz2;

	assert(!(mode1 & OSTACK_STORE) && !(mode2 & OSTACK_STORE));

	/* The quiver can have stricter limits. */
	if (mode1 & OSTACK_QUIVER) {
		int limit = z_info->quiver_slot_size /
			(tval_is_ammo(obj1) ?
			1 : z_info->thrown_quiver_mult);

		if (mode2 & OSTACK_QUIVER) {
			int difference = limit - largest;

			newsz1 = largest + difference;
			newsz2 = smallest - difference;
		} else {
			/* Handle the possibly different limits. */
			newsz1 = limit;
			newsz2 = (largest + smallest) - limit;
			assert(newsz2 < obj1->kind->base->max_stack);
		}
	} else if (mode2 & OSTACK_QUIVER) {
		/* Handle the possibly different limits. */
		int limit = z_info->quiver_slot_size /
			(tval_is_ammo(obj2) ?
			1 : z_info->thrown_quiver_mult);

		newsz1 = (largest + smallest) - limit;
		newsz2 = limit;
		assert(newsz1 < obj1->kind->base->max_stack);
	} else {
		int difference = obj1->kind->base->max_stack - largest;

		newsz1 = largest + difference;
		newsz2 = smallest - difference;
	}

	obj1->number = newsz1;
	obj2->number = newsz2;

	object_absorb_merge(obj1, obj2);
}